

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

bool substituteImports(value *v)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>
  *this;
  int iVar1;
  string *this_00;
  long lVar2;
  pointer pcVar3;
  pointer pbVar4;
  bool bVar5;
  iterator __position;
  undefined7 uVar9;
  ostream *poVar6;
  _Base_ptr p_Var7;
  _Rb_tree_node_base *p_Var8;
  runtime_error *this_01;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
  *p_Var10;
  void *pvVar11;
  pointer pbVar12;
  _Alloc_hider _Var13;
  _Rb_tree_node_base *p_Var14;
  undefined1 local_2c8 [8];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>
  impit;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  undefined1 local_98 [8];
  string importFile;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> i;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
  *local_50;
  undefined1 local_48 [8];
  value importValue;
  
  if (v->type_ != 5) {
    importValue.u_._4_4_ = 1;
    goto LAB_00114a34;
  }
  this_00 = (v->u_).string_;
  local_2c8 = (undefined1  [8])&impit.first._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2c8,"import","");
  __position = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                       *)this_00,(key_type *)local_2c8);
  if (local_2c8 != (undefined1  [8])&impit.first._M_string_length) {
    operator_delete((void *)local_2c8);
  }
  uVar9 = (undefined7)((ulong)&this_00->_M_string_length >> 8);
  if (__position._M_node == (_Base_ptr)&this_00->_M_string_length) {
    importValue.u_._4_4_ = (undefined4)CONCAT71(uVar9,1);
    p_Var7 = *(_Base_ptr *)((long)&this_00->field_2 + 8);
    if (p_Var7 != __position._M_node) {
      do {
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>
        ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>
                *)local_2c8,
               (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>
                *)(p_Var7 + 1));
        bVar5 = substituteImports((value *)((long)&impit.first.field_2 + 8));
        pvVar11 = (void *)impit.second._0_8_;
        if (impit.first.field_2._8_4_ == 5) {
          if (impit.second._0_8_ == 0) {
LAB_001149a5:
            pvVar11 = (void *)0x0;
          }
          else {
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
            ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                         *)impit.second._0_8_);
          }
LAB_001149a8:
          operator_delete(pvVar11);
        }
        else {
          if (impit.first.field_2._8_4_ == 4) {
            if (impit.second._0_8_ == 0) goto LAB_001149a5;
            std::vector<picojson::value,_std::allocator<picojson::value>_>::~vector
                      ((vector<picojson::value,_std::allocator<picojson::value>_> *)
                       impit.second._0_8_);
            goto LAB_001149a8;
          }
          if (impit.first.field_2._8_4_ == 3) {
            if (impit.second._0_8_ == 0) goto LAB_001149a5;
            if (*(void **)impit.second._0_8_ != (void *)(impit.second._0_8_ + 0x10)) {
              operator_delete(*(void **)impit.second._0_8_);
            }
            goto LAB_001149a8;
          }
        }
        if (local_2c8 != (undefined1  [8])&impit.first._M_string_length) {
          operator_delete((void *)local_2c8);
        }
        if (!bVar5) goto LAB_00114a2d;
        p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
      } while (p_Var7 != __position._M_node);
    }
    goto LAB_00114a34;
  }
  importValue.u_._4_4_ = (undefined4)CONCAT71(uVar9,1);
  if (__position._M_node[2]._M_color != 3) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_01,"\"type mismatch! call is<type>() before get<type>()\" && is<std::string>()")
    ;
    __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_98 = (undefined1  [8])&importFile._M_string_length;
  lVar2 = *(long *)__position._M_node[2]._M_parent;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_98,lVar2,
             (long)&(__position._M_node[2]._M_parent)->_M_parent->_M_color + lVar2);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
  ::_M_erase_aux((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                  *)this_00,(const_iterator)__position._M_node);
  pbVar4 = options.includeDirs.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_48._0_4_ = 0;
  if (options.includeDirs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      options.includeDirs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            ((long)&importFile.field_2 + 8);
    pbVar12 = options.includeDirs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      importFile.field_2._8_8_ = &i._M_string_length;
      pcVar3 = (pbVar12->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__lhs,pcVar3,pcVar3 + pbVar12->_M_string_length);
      local_2c8 = (undefined1  [8])((ulong)local_2c8 & 0xffffffff00000000);
      picojson::value::operator=((value *)local_48,(value *)local_2c8);
      _Var13 = impit.first._M_dataplus;
      if (local_2c8._0_4_ == 5) {
        if (impit.first._M_dataplus._M_p == (pointer)0x0) {
LAB_001147a3:
          _Var13._M_p = (pointer)0x0;
        }
        else {
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                       *)impit.first._M_dataplus._M_p);
        }
LAB_001147a6:
        operator_delete(_Var13._M_p);
      }
      else {
        if (local_2c8._0_4_ == 4) {
          if (impit.first._M_dataplus._M_p == (pointer)0x0) goto LAB_001147a3;
          std::vector<picojson::value,_std::allocator<picojson::value>_>::~vector
                    ((vector<picojson::value,_std::allocator<picojson::value>_> *)
                     impit.first._M_dataplus._M_p);
          goto LAB_001147a6;
        }
        if (local_2c8._0_4_ == 3) {
          if (impit.first._M_dataplus._M_p == (pointer)0x0) goto LAB_001147a3;
          if (*impit.first._M_dataplus._M_p != impit.first._M_dataplus._M_p + 0x10) {
            operator_delete(*impit.first._M_dataplus._M_p);
          }
          goto LAB_001147a6;
        }
      }
      std::operator+(&local_b8,__lhs,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98);
      std::ifstream::ifstream((value *)local_2c8,local_b8._M_dataplus._M_p,_S_in);
      iVar1 = *(int *)((long)&impit.first.field_2 + *(long *)((long)local_2c8 + -0x18) + 8);
      std::ifstream::close();
      std::ifstream::~ifstream((value *)local_2c8);
      if ((iVar1 == 0) && (bVar5 = loadFile(&local_b8,(value *)local_48), bVar5)) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p);
        }
        if ((size_type *)importFile.field_2._8_8_ != &i._M_string_length) {
          operator_delete((void *)importFile.field_2._8_8_);
        }
        bVar5 = true;
        if (local_48._0_4_ != 5) goto LAB_001148c5;
        p_Var8 = *(_Rb_tree_node_base **)(importValue._0_8_ + 0x18);
        p_Var14 = (_Rb_tree_node_base *)(importValue._0_8_ + 8);
        bVar5 = true;
        if (p_Var8 == p_Var14) goto LAB_001148c5;
        this = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>
                *)((long)&importFile.field_2 + 8);
        goto LAB_00114aa5;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p);
      }
      if ((size_type *)importFile.field_2._8_8_ != &i._M_string_length) {
        operator_delete((void *)importFile.field_2._8_8_);
      }
      pbVar12 = pbVar12 + 1;
    } while (pbVar12 != pbVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"error: failed \'import\' substitution of \'",0x28);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(char *)local_98,(long)importFile._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\'",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  bVar5 = false;
  goto LAB_001148c5;
  while( true ) {
    if (local_2c8 != (undefined1  [8])&impit.first._M_string_length) {
      operator_delete((void *)local_2c8);
    }
    p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
    if (p_Var8 == p_Var14) break;
LAB_00114aa5:
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>
    ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>
            *)local_2c8,
           (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>
            *)(p_Var8 + 1));
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>
    ::pair<picojson::value_&,_true>
              (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c8,
               (value *)((long)&impit.first.field_2 + 8));
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,picojson::value>,std::_Select1st<std::pair<std::__cxx11::string_const,picojson::value>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,picojson::value>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,picojson::value>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,picojson::value>,std::_Select1st<std::pair<std::__cxx11::string_const,picojson::value>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,picojson::value>>>
                *)this_00,this);
    p_Var10 = local_50;
    if (i.field_2._8_4_ == 5) {
      if (local_50 ==
          (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
           *)0x0) {
LAB_00114b26:
        p_Var10 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                   *)0x0;
      }
      else {
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
        ::~_Rb_tree(local_50);
      }
LAB_00114b28:
      operator_delete(p_Var10);
    }
    else {
      if (i.field_2._8_4_ == 4) {
        if (local_50 ==
            (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
             *)0x0) goto LAB_00114b26;
        std::vector<picojson::value,_std::allocator<picojson::value>_>::~vector
                  ((vector<picojson::value,_std::allocator<picojson::value>_> *)local_50);
        goto LAB_00114b28;
      }
      if (i.field_2._8_4_ == 3) {
        if (local_50 ==
            (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
             *)0x0) goto LAB_00114b26;
        if ((_Base_ptr *)*(undefined1 **)&local_50->_M_impl !=
            &(local_50->_M_impl).super__Rb_tree_header._M_header._M_parent) {
          operator_delete(*(undefined1 **)&local_50->_M_impl);
        }
        goto LAB_00114b28;
      }
    }
    if ((size_type *)importFile.field_2._8_8_ != &i._M_string_length) {
      operator_delete((void *)importFile.field_2._8_8_);
    }
    pvVar11 = (void *)impit.second._0_8_;
    if (impit.first.field_2._8_4_ == 5) {
      if (impit.second._0_8_ == 0) {
LAB_00114ba2:
        pvVar11 = (void *)0x0;
      }
      else {
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                     *)impit.second._0_8_);
      }
LAB_00114ba4:
      operator_delete(pvVar11);
    }
    else {
      if (impit.first.field_2._8_4_ == 4) {
        if (impit.second._0_8_ == 0) goto LAB_00114ba2;
        std::vector<picojson::value,_std::allocator<picojson::value>_>::~vector
                  ((vector<picojson::value,_std::allocator<picojson::value>_> *)impit.second._0_8_);
        goto LAB_00114ba4;
      }
      if (impit.first.field_2._8_4_ == 3) {
        if (impit.second._0_8_ == 0) goto LAB_00114ba2;
        if (*(void **)impit.second._0_8_ != (void *)(impit.second._0_8_ + 0x10)) {
          operator_delete(*(void **)impit.second._0_8_);
        }
        goto LAB_00114ba4;
      }
    }
  }
  bVar5 = true;
LAB_001148c5:
  if (local_48._0_4_ == 5) {
    if (importValue._0_8_ == 0) {
LAB_00114a09:
      importValue._0_8_ = (void *)0x0;
    }
    else {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                   *)importValue._0_8_);
    }
LAB_00114a0b:
    operator_delete((void *)importValue._0_8_);
  }
  else {
    if (local_48._0_4_ == 4) {
      if (importValue._0_8_ == 0) goto LAB_00114a09;
      std::vector<picojson::value,_std::allocator<picojson::value>_>::~vector
                ((vector<picojson::value,_std::allocator<picojson::value>_> *)importValue._0_8_);
      goto LAB_00114a0b;
    }
    if (local_48._0_4_ == 3) {
      if (importValue._0_8_ == 0) goto LAB_00114a09;
      if (*(void **)importValue._0_8_ != (void *)(importValue._0_8_ + 0x10)) {
        operator_delete(*(void **)importValue._0_8_);
      }
      goto LAB_00114a0b;
    }
  }
  if (local_98 != (undefined1  [8])&importFile._M_string_length) {
    operator_delete((void *)local_98);
  }
  if (!bVar5) {
LAB_00114a2d:
    importValue.u_._4_4_ = 0;
  }
LAB_00114a34:
  return SUB41(importValue.u_._4_4_,0);
}

Assistant:

static bool substituteImports(value *v)
{
    if (v->is<object>()) {
        object &o = v->get<object>();

        auto it = o.find("import");
        if (it != o.end()) {
            std::string importFile = it->second.get<std::string>();
            o.erase(it);

            value importValue;
            if (!loadFileInIncludeDirs(importFile, &importValue)) {
                cerr << "error: failed 'import' substitution of '" << importFile << "'" << endl;
                return false;
            }
            if (importValue.is<object>()) {
                for (auto impit : importValue.get<object>())
                    o.insert(pair<string,value>(impit.first, impit.second));
            }
        } else {
            for (auto i : o) {
                bool ok = substituteImports(&i.second);
                if (!ok)
                    return false;
            }
        }
    }
    return true;
}